

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O0

void juzzlin::StreamTest::assertNotString(stringstream *stream,string *message)

{
  char *__rhs;
  runtime_error *this;
  ulong in_RSI;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_50 [32];
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::str();
  __rhs = (char *)std::__cxx11::string::find(local_30,local_10);
  std::__cxx11::string::~string(local_30);
  if (__rhs != (char *)0xffffffffffffffff) {
    uVar1 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff18),__rhs);
    std::__cxx11::stringstream::str();
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff18),__rhs);
    std::runtime_error::runtime_error(this,local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void assertNotString(std::stringstream & stream, const std::string & message)
{
    if (stream.str().find(message) != std::string::npos) {
        throw std::runtime_error("ERROR!!: '" + message + "' was found in '" + stream.str() + "'");
    }
}